

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O0

int64_t lookup_uid(void *private_data,char *uname,int64_t uid)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  passwd *ppStack_118;
  int r;
  passwd *result;
  passwd pwent;
  char *allocated;
  char *buffer;
  size_t bufsize;
  char _buffer [128];
  bucket *ucache;
  bucket *b;
  void *pvStack_28;
  int h;
  int64_t uid_local;
  char *uname_local;
  void *private_data_local;
  
  private_data_local = (void *)uid;
  if ((uname != (char *)0x0) && (*uname != '\0')) {
    uVar1 = hash(uname);
    plVar3 = (long *)((long)private_data + ((ulong)(long)(int)uVar1 % 0x7f) * 0x10);
    if ((*plVar3 == 0) ||
       ((*(uint *)(plVar3 + 1) != uVar1 || (iVar2 = strcmp(uname,(char *)*plVar3), iVar2 != 0)))) {
      free((void *)*plVar3);
      pcVar4 = strdup(uname);
      *plVar3 = (long)pcVar4;
      *(uint *)(plVar3 + 1) = uVar1;
      buffer = (char *)0x80;
      allocated = (char *)&bufsize;
      pwent.pw_shell = (char *)0x0;
      do {
        ppStack_118 = (passwd *)&result;
        iVar2 = getpwnam_r(uname,(passwd *)&result,allocated,(size_t)buffer,&stack0xfffffffffffffee8
                          );
        if ((iVar2 == 0) || (iVar2 != 0x22)) break;
        buffer = (char *)((long)buffer << 1);
        free(pwent.pw_shell);
        pwent.pw_shell = (char *)malloc((size_t)buffer);
        allocated = pwent.pw_shell;
      } while (pwent.pw_shell != (char *)0x0);
      pvStack_28 = (void *)uid;
      if (ppStack_118 != (passwd *)0x0) {
        pvStack_28 = (void *)(ulong)ppStack_118->pw_uid;
      }
      free(pwent.pw_shell);
      *(int *)((long)plVar3 + 0xc) = (int)pvStack_28;
      private_data_local = pvStack_28;
    }
    else {
      private_data_local = (void *)(ulong)*(uint *)((long)plVar3 + 0xc);
    }
  }
  return (int64_t)private_data_local;
}

Assistant:

static int64_t
lookup_uid(void *private_data, const char *uname, int64_t uid)
{
	int h;
	struct bucket *b;
	struct bucket *ucache = (struct bucket *)private_data;

	/* If no uname, just use the uid provided. */
	if (uname == NULL || *uname == '\0')
		return (uid);

	/* Try to find uname in the cache. */
	h = hash(uname);
	b = &ucache[h % cache_size ];
	if (b->name != NULL && b->hash == h && strcmp(uname, b->name) == 0)
		return ((uid_t)b->id);

	/* Free the cache slot for a new entry. */
	free(b->name);
	b->name = strdup(uname);
	/* Note: If strdup fails, that's okay; we just won't cache. */
	b->hash = h;
#if HAVE_PWD_H
#  if HAVE_GETPWNAM_R
	{
		char _buffer[128];
		size_t bufsize = 128;
		char *buffer = _buffer;
		char *allocated = NULL;
		struct passwd	pwent, *result;
		int r;

		for (;;) {
			result = &pwent; /* Old getpwnam_r ignores last arg. */
			r = getpwnam_r(uname, &pwent, buffer, bufsize, &result);
			if (r == 0)
				break;
			if (r != ERANGE)
				break;
			bufsize *= 2;
			free(allocated);
			allocated = malloc(bufsize);
			if (allocated == NULL)
				break;
			buffer = allocated;
		}
		if (result != NULL)
			uid = result->pw_uid;
		free(allocated);
	}
#  else /* HAVE_GETPWNAM_R */
	{
		struct passwd *result;

		result = getpwnam(uname);
		if (result != NULL)
			uid = result->pw_uid;
	}
#endif	/* HAVE_GETPWNAM_R */
#elif defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: do a uname->uid lookup for Windows. */
#else
	#error No way to look up uids on this platform
#endif
	b->id = (uid_t)uid;

	return (uid);
}